

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool execute(Camera *camera,int x)

{
  mt19937 *pmVar1;
  float *pfVar2;
  uint in_ESI;
  Camera *in_RDI;
  float fVar3;
  anon_class_1_0_00000001 clamp;
  Vector3f col;
  Ray camRay;
  int y;
  Ray *in_stack_00000300;
  Runtime *in_stack_00000308;
  result_type in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  anon_class_1_0_00000001 local_65 [29];
  Vector3f local_48;
  undefined1 local_3c [28];
  uint local_20;
  uint local_c;
  Camera *local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  if (execute::rt[(int)in_ESI].g == (mt19937 *)0x0) {
    pmVar1 = (mt19937 *)operator_new(5000);
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::mersenne_twister_engine
              ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
    execute::rt[(int)local_c].g = pmVar1;
  }
  local_20 = Camera::getHeight(local_8);
  while (local_20 = local_20 - 1, -1 < (int)local_20) {
    (*local_8->_vptr_Camera[2])
              (local_3c,local_8,(ulong)local_c,(ulong)local_20,execute::rt[(int)local_c].g);
    Ray::Ray((Ray *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (Ray *)(execute::rt + (int)local_c));
    trace(in_stack_00000308,in_stack_00000300);
    pfVar2 = Vector3f::operator[](&local_48,0);
    in_stack_ffffffffffffff84 = execute::anon_class_1_0_00000001::operator()(local_65,*pfVar2);
    pfVar2 = Vector3f::operator[](&local_48,0);
    *pfVar2 = in_stack_ffffffffffffff84;
    pfVar2 = Vector3f::operator[](&local_48,1);
    fVar3 = execute::anon_class_1_0_00000001::operator()(local_65,*pfVar2);
    pfVar2 = Vector3f::operator[](&local_48,1);
    *pfVar2 = fVar3;
    pfVar2 = Vector3f::operator[](&local_48,2);
    fVar3 = execute::anon_class_1_0_00000001::operator()(local_65,*pfVar2);
    pfVar2 = Vector3f::operator[](&local_48,2);
    *pfVar2 = fVar3;
    Vector3f::operator+=
              ((Vector3f *)(tot + (long)(int)local_20 * 0xc + (long)(int)local_c * 24000),&local_48)
    ;
  }
  return true;
}

Assistant:

bool execute(Camera* camera, int x)
{
	static Runtime rt[2000];
	if (!rt[x].g)
	{
		rt[x].g = new RNG_TYPE(x);
		/*
		rt[x].davg.resize(scene.mat_num);
		rt[x].favg.resize(scene.mat_num);
		for (auto& x : rt[x].davg) x = 1;
		for (auto& x : rt[x].favg) x = 1;
		*/
	}
	for (int y = int(camera->getHeight() - 1); y >= 0; --y)
	{
		Ray camRay = camera->generateRay(x, y, *rt[x].g);
		Vector3f col = trace(rt[x], camRay);
		auto clamp = [&](float t) {if (t > 10) t = 10; if (t < 0) t = 0; if (t != t) t = 0; return t; };
		col[0] = clamp(col[0]);
		col[1] = clamp(col[1]);
		col[2] = clamp(col[2]);
		tot[x][y] += col;
	}
	return 1;
}